

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprIfTrue(Parse *pParse,Expr *pExpr,int dest,int jumpIfNull)

{
  byte bVar1;
  Vdbe *p;
  u8 uVar2;
  uint uVar3;
  int iVar4;
  Expr *pEVar5;
  Select *pSVar6;
  int iVar7;
  uint op;
  bool bVar8;
  int regFree1;
  int regFree2;
  
  p = pParse->pVdbe;
  _regFree1 = 0;
  if (pExpr == (Expr *)0x0 || p == (Vdbe *)0x0) {
    return;
  }
  bVar1 = pExpr->op;
  uVar3 = (uint)bVar1;
  op = (uint)bVar1;
  if (0x9f < bVar1) {
    if (bVar1 == 0xa0) goto switchD_001993bc_caseD_2d;
    if (bVar1 == 0xa7) {
      bVar8 = pExpr->op2 == 0xa0;
      uVar3 = sqlite3ExprTruthValue(pExpr->pRight);
      jumpIfNull = (uint)bVar8 << 4;
      pEVar5 = pExpr->pLeft;
      if (uVar3 == bVar8) goto LAB_001994d8;
      goto LAB_001995fc;
    }
    goto switchD_001993bc_caseD_2e;
  }
  switch(bVar1) {
  case 0x2b:
  case 0x2c:
    pEVar5 = sqlite3ExprSimplifiedAndOr(pExpr);
    if (pEVar5 == pExpr) {
      if (op == 0x2c) {
        iVar4 = pParse->nLabel + -1;
        pParse->nLabel = iVar4;
        sqlite3ExprIfFalse(pParse,pExpr->pLeft,iVar4,jumpIfNull ^ 0x10);
        sqlite3ExprIfTrue(pParse,pExpr->pRight,dest,jumpIfNull);
        goto LAB_001995cf;
      }
      sqlite3ExprIfTrue(pParse,pExpr->pLeft,dest,jumpIfNull);
      pEVar5 = pExpr->pRight;
    }
LAB_001995fc:
    sqlite3ExprIfTrue(pParse,pEVar5,dest,jumpIfNull);
    goto LAB_00199601;
  case 0x2d:
switchD_001993bc_caseD_2d:
    uVar3 = bVar1 == 0x2d | 0x34;
    jumpIfNull = 0x80;
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    pEVar5 = pExpr->pLeft;
    uVar2 = pEVar5->op;
    if (uVar2 == 0xa8) {
      uVar2 = pEVar5->op2;
    }
    if (uVar2 == 0x83) {
      pSVar6 = (pEVar5->x).pSelect;
LAB_00199476:
      if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar6->pEList)->pList->nExpr)
      goto switchD_001993bc_caseD_2e;
    }
    else if (uVar2 == 0xa9) {
      pSVar6 = (Select *)&pEVar5->x;
      goto LAB_00199476;
    }
    iVar7 = sqlite3ExprCodeTemp(pParse,pEVar5,&regFree1);
    iVar4 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    codeCompare(pParse,pExpr->pLeft,pExpr->pRight,uVar3,iVar7,iVar4,dest,jumpIfNull);
    goto LAB_00199601;
  case 0x2e:
  case 0x2f:
    goto switchD_001993bc_caseD_2e;
  case 0x30:
    exprCodeBetween(pParse,pExpr,dest,sqlite3ExprIfTrue,jumpIfNull);
    goto LAB_00199601;
  case 0x31:
    iVar4 = pParse->nLabel + -1;
    pParse->nLabel = iVar4;
    iVar7 = dest;
    if (jumpIfNull == 0) {
      iVar7 = iVar4;
    }
    sqlite3ExprCodeIN(pParse,pExpr,iVar4,iVar7);
    sqlite3VdbeAddOp3(p,0xb,0,dest,0);
LAB_001995cf:
    sqlite3VdbeResolveLabel(p,iVar4);
    goto LAB_00199601;
  case 0x32:
  case 0x33:
    iVar7 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    goto LAB_00199501;
  }
  if (op == 0x13) {
    pEVar5 = pExpr->pLeft;
LAB_001994d8:
    sqlite3ExprIfFalse(pParse,pEVar5,dest,jumpIfNull);
    goto LAB_00199601;
  }
switchD_001993bc_caseD_2e:
  if ((pExpr->flags & 0x10000001) == 0x10000000) {
    op = 0xb;
    iVar7 = 0;
LAB_00199501:
    uVar3 = 0;
  }
  else {
    if ((pExpr->flags & 0x20000001) == 0x20000000) goto LAB_00199601;
    iVar7 = sqlite3ExprCodeTemp(pParse,pExpr,&regFree1);
    uVar3 = (uint)(jumpIfNull != 0);
    op = 0x12;
  }
  sqlite3VdbeAddOp3(p,op,iVar7,dest,uVar3);
LAB_00199601:
  if (regFree1 != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = regFree1;
    }
  }
  if (regFree2 != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = regFree2;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprIfTrue(Parse *pParse, Expr *pExpr, int dest, int jumpIfNull){
  Vdbe *v = pParse->pVdbe;
  int op = 0;
  int regFree1 = 0;
  int regFree2 = 0;
  int r1, r2;

  assert( jumpIfNull==SQLITE_JUMPIFNULL || jumpIfNull==0 );
  if( NEVER(v==0) )     return;  /* Existence of VDBE checked by caller */
  if( NEVER(pExpr==0) ) return;  /* No way this can happen */
  op = pExpr->op;
  switch( op ){
    case TK_AND:
    case TK_OR: {
      Expr *pAlt = sqlite3ExprSimplifiedAndOr(pExpr);
      if( pAlt!=pExpr ){
        sqlite3ExprIfTrue(pParse, pAlt, dest, jumpIfNull);
      }else if( op==TK_AND ){
        int d2 = sqlite3VdbeMakeLabel(pParse);
        testcase( jumpIfNull==0 );
        sqlite3ExprIfFalse(pParse, pExpr->pLeft, d2,
                           jumpIfNull^SQLITE_JUMPIFNULL);
        sqlite3ExprIfTrue(pParse, pExpr->pRight, dest, jumpIfNull);
        sqlite3VdbeResolveLabel(v, d2);
      }else{
        testcase( jumpIfNull==0 );
        sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest, jumpIfNull);
        sqlite3ExprIfTrue(pParse, pExpr->pRight, dest, jumpIfNull);
      }
      break;
    }
    case TK_NOT: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest, jumpIfNull);
      break;
    }
    case TK_TRUTH: {
      int isNot;      /* IS NOT TRUE or IS NOT FALSE */
      int isTrue;     /* IS TRUE or IS NOT TRUE */
      testcase( jumpIfNull==0 );
      isNot = pExpr->op2==TK_ISNOT;
      isTrue = sqlite3ExprTruthValue(pExpr->pRight);
      testcase( isTrue && isNot );
      testcase( !isTrue && isNot );
      if( isTrue ^ isNot ){
        sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest,
                          isNot ? SQLITE_JUMPIFNULL : 0);
      }else{
        sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest,
                           isNot ? SQLITE_JUMPIFNULL : 0);
      }
      break;
    }
    case TK_IS:
    case TK_ISNOT:
      testcase( op==TK_IS );
      testcase( op==TK_ISNOT );
      op = (op==TK_IS) ? TK_EQ : TK_NE;
      jumpIfNull = SQLITE_NULLEQ;
      /* Fall thru */
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      if( sqlite3ExprIsVector(pExpr->pLeft) ) goto default_expr;
      testcase( jumpIfNull==0 );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, dest, jumpIfNull);
      assert(TK_LT==OP_Lt); testcase(op==OP_Lt); VdbeCoverageIf(v,op==OP_Lt);
      assert(TK_LE==OP_Le); testcase(op==OP_Le); VdbeCoverageIf(v,op==OP_Le);
      assert(TK_GT==OP_Gt); testcase(op==OP_Gt); VdbeCoverageIf(v,op==OP_Gt);
      assert(TK_GE==OP_Ge); testcase(op==OP_Ge); VdbeCoverageIf(v,op==OP_Ge);
      assert(TK_EQ==OP_Eq); testcase(op==OP_Eq);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull==SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull!=SQLITE_NULLEQ);
      assert(TK_NE==OP_Ne); testcase(op==OP_Ne);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull==SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull!=SQLITE_NULLEQ);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      assert( TK_ISNULL==OP_IsNull );   testcase( op==TK_ISNULL );
      assert( TK_NOTNULL==OP_NotNull ); testcase( op==TK_NOTNULL );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      sqlite3VdbeAddOp2(v, op, r1, dest);
      VdbeCoverageIf(v, op==TK_ISNULL);
      VdbeCoverageIf(v, op==TK_NOTNULL);
      testcase( regFree1==0 );
      break;
    }
    case TK_BETWEEN: {
      testcase( jumpIfNull==0 );
      exprCodeBetween(pParse, pExpr, dest, sqlite3ExprIfTrue, jumpIfNull);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_IN: {
      int destIfFalse = sqlite3VdbeMakeLabel(pParse);
      int destIfNull = jumpIfNull ? dest : destIfFalse;
      sqlite3ExprCodeIN(pParse, pExpr, destIfFalse, destIfNull);
      sqlite3VdbeGoto(v, dest);
      sqlite3VdbeResolveLabel(v, destIfFalse);
      break;
    }
#endif
    default: {
    default_expr:
      if( ExprAlwaysTrue(pExpr) ){
        sqlite3VdbeGoto(v, dest);
      }else if( ExprAlwaysFalse(pExpr) ){
        /* No-op */
      }else{
        r1 = sqlite3ExprCodeTemp(pParse, pExpr, &regFree1);
        sqlite3VdbeAddOp3(v, OP_If, r1, dest, jumpIfNull!=0);
        VdbeCoverage(v);
        testcase( regFree1==0 );
        testcase( jumpIfNull==0 );
      }
      break;
    }
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);  
}